

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

void __thiscall
cmGraphVizWriter::ReadSettings
          (cmGraphVizWriter *this,char *settingsFileName,char *fallbackSettingsFileName)

{
  pointer __s;
  bool bVar1;
  cmLocalGenerator *__p;
  ostream *poVar2;
  char *pcVar3;
  ulong uVar4;
  undefined1 local_1710 [8];
  RegularExpression currentRegex;
  string *currentRegexString;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreTargetsRegExVector;
  string local_1600;
  char *local_15e0;
  char *value_12;
  string ignoreTargetsRegexes;
  string local_15b0;
  allocator<char> local_1589;
  string local_1588;
  char *local_1568;
  char *value_11;
  string local_1558;
  allocator<char> local_1531;
  string local_1530;
  char *local_1510;
  char *value_10;
  string local_1500;
  allocator<char> local_14d9;
  string local_14d8;
  char *local_14b8;
  char *value_9;
  string local_14a8;
  allocator<char> local_1481;
  string local_1480;
  char *local_1460;
  char *value_8;
  string local_1450;
  allocator<char> local_1429;
  string local_1428;
  char *local_1408;
  char *value_7;
  string local_13f8;
  allocator<char> local_13d1;
  string local_13d0;
  char *local_13b0;
  char *value_6;
  string local_13a0;
  allocator<char> local_1379;
  string local_1378;
  char *local_1358;
  char *value_5;
  string local_1348;
  allocator<char> local_1321;
  string local_1320;
  char *local_1300;
  char *value_4;
  string local_12f0;
  char *local_12d0;
  char *value_3;
  string local_12c0;
  char *local_12a0;
  char *value_2;
  string local_1290;
  char *local_1270;
  char *value_1;
  string local_1260;
  char *local_1240;
  char *value;
  string local_1230;
  undefined4 local_120c;
  pointer local_1208;
  char *inFileName;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> lg;
  undefined1 local_11e0 [8];
  cmMakefile mf;
  cmGlobalGenerator ggi;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_399;
  string local_398;
  undefined1 local_378 [8];
  cmake cm;
  char *fallbackSettingsFileName_local;
  char *settingsFileName_local;
  cmGraphVizWriter *this_local;
  
  cm.TraceOnlyThisSources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)fallbackSettingsFileName;
  cmake::cmake((cmake *)local_378,RoleScript,Unknown);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"",&local_399);
  cmake::SetHomeDirectory((cmake *)local_378,&local_398);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"",&local_3d1);
  cmake::SetHomeOutputDirectory((cmake *)local_378,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)&ggi.InstallTargetEnabled,(cmake *)local_378);
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&ggi.InstallTargetEnabled);
  cmGlobalGenerator::cmGlobalGenerator
            ((cmGlobalGenerator *)&mf.IsSourceFileTryCompile,(cmake *)local_378);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)&lg,(cmake *)local_378);
  cmMakefile::cmMakefile
            ((cmMakefile *)local_11e0,(cmGlobalGenerator *)&mf.IsSourceFileTryCompile,
             (cmStateSnapshot *)&lg);
  __p = cmGlobalGenerator::CreateLocalGenerator
                  ((cmGlobalGenerator *)&mf.IsSourceFileTryCompile,(cmMakefile *)local_11e0);
  std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>::
  unique_ptr<std::default_delete<cmLocalGenerator>,void>
            ((unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>> *)&inFileName,__p);
  local_1208 = (pointer)settingsFileName;
  bVar1 = cmsys::SystemTools::FileExists(settingsFileName);
  if (!bVar1) {
    local_1208 = cm.TraceOnlyThisSources.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    bVar1 = cmsys::SystemTools::FileExists
                      ((char *)cm.TraceOnlyThisSources.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) {
      local_120c = 1;
      goto LAB_0050a5e3;
    }
  }
  __s = local_1208;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1230,(char *)__s,(allocator<char> *)((long)&value + 7));
  bVar1 = cmMakefile::ReadListFile((cmMakefile *)local_11e0,&local_1230);
  std::__cxx11::string::~string((string *)&local_1230);
  std::allocator<char>::~allocator((allocator<char> *)((long)&value + 7));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Reading GraphViz options file: ");
    poVar2 = std::operator<<(poVar2,(char *)local_1208);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1260,"GRAPHVIZ_GRAPH_TYPE",(allocator<char> *)((long)&value_1 + 7));
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_11e0,&local_1260);
    std::__cxx11::string::~string((string *)&local_1260);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_1 + 7));
    local_1240 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)this,pcVar3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1290,"GRAPHVIZ_GRAPH_NAME",(allocator<char> *)((long)&value_2 + 7));
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_11e0,&local_1290);
    std::__cxx11::string::~string((string *)&local_1290);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_2 + 7));
    local_1270 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->GraphName,pcVar3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_12c0,"GRAPHVIZ_GRAPH_HEADER",(allocator<char> *)((long)&value_3 + 7)
              );
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_11e0,&local_12c0);
    std::__cxx11::string::~string((string *)&local_12c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_3 + 7));
    local_12a0 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->GraphHeader,pcVar3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_12f0,"GRAPHVIZ_NODE_PREFIX",(allocator<char> *)((long)&value_4 + 7))
    ;
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_11e0,&local_12f0);
    std::__cxx11::string::~string((string *)&local_12f0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_4 + 7));
    local_12d0 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->GraphNodePrefix,pcVar3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1320,"GRAPHVIZ_EXECUTABLES",&local_1321);
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_11e0,&local_1320);
    std::__cxx11::string::~string((string *)&local_1320);
    std::allocator<char>::~allocator(&local_1321);
    local_1300 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1348,"GRAPHVIZ_EXECUTABLES",
                 (allocator<char> *)((long)&value_5 + 7));
      bVar1 = cmMakefile::IsOn((cmMakefile *)local_11e0,&local_1348);
      this->GenerateForExecutables = bVar1;
      std::__cxx11::string::~string((string *)&local_1348);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_5 + 7));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1378,"GRAPHVIZ_STATIC_LIBS",&local_1379);
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_11e0,&local_1378);
    std::__cxx11::string::~string((string *)&local_1378);
    std::allocator<char>::~allocator(&local_1379);
    local_1358 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_13a0,"GRAPHVIZ_STATIC_LIBS",
                 (allocator<char> *)((long)&value_6 + 7));
      bVar1 = cmMakefile::IsOn((cmMakefile *)local_11e0,&local_13a0);
      this->GenerateForStaticLibs = bVar1;
      std::__cxx11::string::~string((string *)&local_13a0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_6 + 7));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_13d0,"GRAPHVIZ_SHARED_LIBS",&local_13d1);
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_11e0,&local_13d0);
    std::__cxx11::string::~string((string *)&local_13d0);
    std::allocator<char>::~allocator(&local_13d1);
    local_13b0 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_13f8,"GRAPHVIZ_SHARED_LIBS",
                 (allocator<char> *)((long)&value_7 + 7));
      bVar1 = cmMakefile::IsOn((cmMakefile *)local_11e0,&local_13f8);
      this->GenerateForSharedLibs = bVar1;
      std::__cxx11::string::~string((string *)&local_13f8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_7 + 7));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1428,"GRAPHVIZ_MODULE_LIBS",&local_1429);
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_11e0,&local_1428);
    std::__cxx11::string::~string((string *)&local_1428);
    std::allocator<char>::~allocator(&local_1429);
    local_1408 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1450,"GRAPHVIZ_MODULE_LIBS",
                 (allocator<char> *)((long)&value_8 + 7));
      bVar1 = cmMakefile::IsOn((cmMakefile *)local_11e0,&local_1450);
      this->GenerateForModuleLibs = bVar1;
      std::__cxx11::string::~string((string *)&local_1450);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_8 + 7));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1480,"GRAPHVIZ_INTERFACE",&local_1481);
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_11e0,&local_1480);
    std::__cxx11::string::~string((string *)&local_1480);
    std::allocator<char>::~allocator(&local_1481);
    local_1460 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_14a8,"GRAPHVIZ_INTERFACE",(allocator<char> *)((long)&value_9 + 7))
      ;
      bVar1 = cmMakefile::IsOn((cmMakefile *)local_11e0,&local_14a8);
      this->GenerateForInterface = bVar1;
      std::__cxx11::string::~string((string *)&local_14a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_9 + 7));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_14d8,"GRAPHVIZ_EXTERNAL_LIBS",&local_14d9);
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_11e0,&local_14d8);
    std::__cxx11::string::~string((string *)&local_14d8);
    std::allocator<char>::~allocator(&local_14d9);
    local_14b8 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1500,"GRAPHVIZ_EXTERNAL_LIBS",
                 (allocator<char> *)((long)&value_10 + 7));
      bVar1 = cmMakefile::IsOn((cmMakefile *)local_11e0,&local_1500);
      this->GenerateForExternals = bVar1;
      std::__cxx11::string::~string((string *)&local_1500);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_10 + 7));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1530,"GRAPHVIZ_GENERATE_PER_TARGET",&local_1531);
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_11e0,&local_1530);
    std::__cxx11::string::~string((string *)&local_1530);
    std::allocator<char>::~allocator(&local_1531);
    local_1510 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1558,"GRAPHVIZ_GENERATE_PER_TARGET",
                 (allocator<char> *)((long)&value_11 + 7));
      bVar1 = cmMakefile::IsOn((cmMakefile *)local_11e0,&local_1558);
      this->GeneratePerTarget = bVar1;
      std::__cxx11::string::~string((string *)&local_1558);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_11 + 7));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1588,"GRAPHVIZ_GENERATE_DEPENDERS",&local_1589);
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_11e0,&local_1588);
    std::__cxx11::string::~string((string *)&local_1588);
    std::allocator<char>::~allocator(&local_1589);
    local_1568 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_15b0,"GRAPHVIZ_GENERATE_DEPENDERS",
                 (allocator<char> *)(ignoreTargetsRegexes.field_2._M_local_buf + 0xf));
      bVar1 = cmMakefile::IsOn((cmMakefile *)local_11e0,&local_15b0);
      this->GenerateDependers = bVar1;
      std::__cxx11::string::~string((string *)&local_15b0);
      std::allocator<char>::~allocator
                ((allocator<char> *)(ignoreTargetsRegexes.field_2._M_local_buf + 0xf));
    }
    std::__cxx11::string::string((string *)&value_12);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1600,"GRAPHVIZ_IGNORE_TARGETS",
               (allocator<char> *)
               ((long)&ignoreTargetsRegExVector.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_11e0,&local_1600);
    std::__cxx11::string::~string((string *)&local_1600);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&ignoreTargetsRegExVector.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_15e0 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&value_12,pcVar3);
    }
    std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
              (&this->TargetsToIgnoreRegex);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2);
      cmSystemTools::ExpandListArgument
                ((string *)&value_12,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2,false);
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2);
      currentRegexString =
           (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&currentRegexString), bVar1) {
        currentRegex._200_8_ =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
        cmsys::RegularExpression::RegularExpression((RegularExpression *)local_1710);
        bVar1 = cmsys::RegularExpression::compile
                          ((RegularExpression *)local_1710,(string *)currentRegex._200_8_);
        if (!bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"Could not compile bad regex \"");
          poVar2 = std::operator<<(poVar2,(string *)currentRegex._200_8_);
          poVar2 = std::operator<<(poVar2,"\"");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::push_back
                  (&this->TargetsToIgnoreRegex,(value_type *)local_1710);
        cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_1710);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range2);
    }
    std::__cxx11::string::~string((string *)&value_12);
    local_120c = 0;
  }
  else {
    cmSystemTools::Error
              ("Problem opening GraphViz options file: ",(char *)local_1208,(char *)0x0,(char *)0x0)
    ;
    local_120c = 1;
  }
LAB_0050a5e3:
  std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::~unique_ptr
            ((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)&inFileName);
  cmMakefile::~cmMakefile((cmMakefile *)local_11e0);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&mf.IsSourceFileTryCompile);
  cmake::~cmake((cmake *)local_378);
  return;
}

Assistant:

void cmGraphVizWriter::ReadSettings(const char* settingsFileName,
                                    const char* fallbackSettingsFileName)
{
  cmake cm(cmake::RoleScript, cmState::Unknown);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator ggi(&cm);
  cmMakefile mf(&ggi, cm.GetCurrentSnapshot());
  std::unique_ptr<cmLocalGenerator> lg(ggi.CreateLocalGenerator(&mf));

  const char* inFileName = settingsFileName;

  if (!cmSystemTools::FileExists(inFileName)) {
    inFileName = fallbackSettingsFileName;
    if (!cmSystemTools::FileExists(inFileName)) {
      return;
    }
  }

  if (!mf.ReadListFile(inFileName)) {
    cmSystemTools::Error("Problem opening GraphViz options file: ",
                         inFileName);
    return;
  }

  std::cout << "Reading GraphViz options file: " << inFileName << std::endl;

#define __set_if_set(var, cmakeDefinition)                                    \
  do {                                                                        \
    const char* value = mf.GetDefinition(cmakeDefinition);                    \
    if (value) {                                                              \
      (var) = value;                                                          \
    }                                                                         \
  } while (false)

  __set_if_set(this->GraphType, "GRAPHVIZ_GRAPH_TYPE");
  __set_if_set(this->GraphName, "GRAPHVIZ_GRAPH_NAME");
  __set_if_set(this->GraphHeader, "GRAPHVIZ_GRAPH_HEADER");
  __set_if_set(this->GraphNodePrefix, "GRAPHVIZ_NODE_PREFIX");

#define __set_bool_if_set(var, cmakeDefinition)                               \
  do {                                                                        \
    const char* value = mf.GetDefinition(cmakeDefinition);                    \
    if (value) {                                                              \
      (var) = mf.IsOn(cmakeDefinition);                                       \
    }                                                                         \
  } while (false)

  __set_bool_if_set(this->GenerateForExecutables, "GRAPHVIZ_EXECUTABLES");
  __set_bool_if_set(this->GenerateForStaticLibs, "GRAPHVIZ_STATIC_LIBS");
  __set_bool_if_set(this->GenerateForSharedLibs, "GRAPHVIZ_SHARED_LIBS");
  __set_bool_if_set(this->GenerateForModuleLibs, "GRAPHVIZ_MODULE_LIBS");
  __set_bool_if_set(this->GenerateForInterface, "GRAPHVIZ_INTERFACE");
  __set_bool_if_set(this->GenerateForExternals, "GRAPHVIZ_EXTERNAL_LIBS");
  __set_bool_if_set(this->GeneratePerTarget, "GRAPHVIZ_GENERATE_PER_TARGET");
  __set_bool_if_set(this->GenerateDependers, "GRAPHVIZ_GENERATE_DEPENDERS");

  std::string ignoreTargetsRegexes;
  __set_if_set(ignoreTargetsRegexes, "GRAPHVIZ_IGNORE_TARGETS");

  this->TargetsToIgnoreRegex.clear();
  if (!ignoreTargetsRegexes.empty()) {
    std::vector<std::string> ignoreTargetsRegExVector;
    cmSystemTools::ExpandListArgument(ignoreTargetsRegexes,
                                      ignoreTargetsRegExVector);
    for (std::string const& currentRegexString : ignoreTargetsRegExVector) {
      cmsys::RegularExpression currentRegex;
      if (!currentRegex.compile(currentRegexString)) {
        std::cerr << "Could not compile bad regex \"" << currentRegexString
                  << "\"" << std::endl;
      }
      this->TargetsToIgnoreRegex.push_back(std::move(currentRegex));
    }
  }
}